

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteCScript(WalletBatch *this,uint160 *hash,CScript *redeemScript)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint160>
  local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::CSCRIPT_abi_cxx11_);
  local_60.second.super_base_blob<160U>.m_data._M_elems._16_4_ =
       *(undefined4 *)((hash->super_base_blob<160U>).m_data._M_elems + 0x10);
  local_60.second.super_base_blob<160U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(hash->super_base_blob<160U>).m_data._M_elems;
  local_60.second.super_base_blob<160U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((hash->super_base_blob<160U>).m_data._M_elems + 8);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,uint160>,CScript>
                    (this,&local_60,redeemScript,false);
  std::__cxx11::string::~string((string *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteCScript(const uint160& hash, const CScript& redeemScript)
{
    return WriteIC(std::make_pair(DBKeys::CSCRIPT, hash), redeemScript, false);
}